

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O2

void __thiscall
xmrig::DonateStrategy::onLogin(DonateStrategy *this,IClient *param_1,Document *doc,Value *params)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  String *this_00;
  StringRefType *name;
  StringRefType local_88;
  String local_78;
  StringRefType local_68;
  char buf [40];
  
  name = &local_88;
  allocator = doc->allocator_;
  if (this->m_tls == true) {
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[0x24] = '\0';
    buf[0x25] = '\0';
    buf[0x26] = '\0';
    buf[0x27] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    snprintf(buf,0x28,"stratum+ssl://%s",
             (((this->m_pools).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl
               .super__Vector_impl_data._M_start)->m_url).m_url.m_data);
    name = &local_68;
    local_68.s = "url";
    local_68.length = 3;
    this_00 = &local_78;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this_00,buf,allocator);
  }
  else {
    local_88.s = "url";
    local_88.length = 3;
    this_00 = (String *)buf;
    String::toJSON(this_00);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(params,name,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this_00,allocator);
  return;
}

Assistant:

void xmrig::DonateStrategy::onLogin(IClient *, rapidjson::Document &doc, rapidjson::Value &params)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

#   ifdef XMRIG_FEATURE_TLS
    if (m_tls) {
        char buf[40] = { 0 };
        snprintf(buf, sizeof(buf), "stratum+ssl://%s", m_pools[0].url().data());
        params.AddMember("url", Value(buf, allocator), allocator);
    }
    else {
        params.AddMember("url", m_pools[1].url().toJSON(), allocator);
    }
#   else
    params.AddMember("url", m_pools[0].url().toJSON(), allocator);
#   endif

}